

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Session::~Session(Session *this)

{
  Config *pCVar1;
  pointer pcVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  
  cleanUp();
  pCVar1 = (this->m_config).m_p;
  if (pCVar1 != (Config *)0x0) {
    (*(pCVar1->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_configData).testsOrTags);
  pcVar2 = (this->m_configData).processName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_configData).processName.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_configData).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_configData).name.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_configData).outputFilename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_configData).outputFilename.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_configData).reporterName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_configData).reporterName.field_2) {
    operator_delete(pcVar2);
  }
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector
            (&this->m_unusedTokens);
  std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::~auto_ptr(&(this->m_cli).m_arg);
  std::
  _Rb_tree<int,_std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>,_std::_Select1st<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::~_Rb_tree(&(this->m_cli).m_positionalArgs._M_t);
  std::
  vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::~vector(&(this->m_cli).m_options);
  pIVar3 = (this->m_cli).m_boundProcessName.functionObj;
  if (pIVar3 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar3->_vptr_IArgFunction[1])();
    return;
  }
  return;
}

Assistant:

~Session() {
            Catch::cleanUp();
        }